

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O1

void LiteScript::StateExecutor::I_VALUE_ARGS(State *state,Instruction *instr)

{
  Array *this;
  uint uVar1;
  Object *pOVar2;
  uint uVar3;
  undefined1 auStack_68 [56];
  
  state->line_num = state->line_num + 1;
  if (instr->comp_type == '\x02') {
    Memory::Create((Memory *)auStack_68,(Type *)state->memory);
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::
    emplace_back<LiteScript::Variable>(&state->op_lifo,(Variable *)auStack_68);
    Variable::~Variable((Variable *)auStack_68);
    pOVar2 = Variable::operator->
                       ((state->op_lifo).
                        super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1);
    auStack_68._16_8_ = pOVar2->data;
    uVar3 = (instr->comp_value).v_integer;
    uVar1 = State::GetArgsCount(state);
    if (uVar3 < uVar1) {
      this = (Array *)(auStack_68 + 0x18);
      do {
        State::GetArg((State *)auStack_68,(uint)state);
        Array::operator[](this,(uint)auStack_68._16_8_);
        Variable::operator=((Variable *)(auStack_68 + 0x28),(Variable *)this);
        Variable::~Variable((Variable *)(auStack_68 + 0x28));
        Variable::~Variable((Variable *)this);
        Variable::~Variable((Variable *)auStack_68);
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  return;
}

Assistant:

void LiteScript::StateExecutor::I_VALUE_ARGS(State& state, Instruction& instr) {
    state.line_num++;
    if (instr.comp_type != Instruction::CompType::COMP_TYPE_INTEGER)
        return;
    state.op_lifo.push_back(state.memory.Create(Type::ARRAY));
    Array& a = state.op_lifo.back()->GetData<Array>();
    for (unsigned int i = (unsigned int)instr.comp_value.v_integer, sz = state.GetArgsCount(); i < sz; i++)
        a[i] = state.GetArg(i);
}